

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O2

void event_go_to_roll_call(tgestate_t *state)

{
  long lVar1;
  
  state->bell = '(';
  queue_message(state,message_ROLL_CALL);
  lVar1 = 0;
  do {
    set_character_route(state,"\f\r\x14\x15\x16\x0e\x0f\x17\x18\x19"[lVar1],
                        (route_t)((short)lVar1 + 0x1a));
    lVar1 = lVar1 + 1;
  } while ((char)lVar1 != '\n');
  set_hero_route(state,(route_t *)&go_to_roll_call_t45);
  return;
}

Assistant:

static void event_go_to_roll_call(tgestate_t *state)
{
  assert(state != NULL);

  state->bell = bell_RING_40_TIMES;
  queue_message(state, message_ROLL_CALL);
  go_to_roll_call(state);
}